

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocusTanFixedRadiusArc.cpp
# Opt level: O3

int GeoCalcs::LocusTanFixedRadiusArc
              (Locus *loc1,Locus *loc2,double radius,int *dir,LLPoint *center,LLPoint *intersection1
              ,LLPoint *intersection2,double dTol,double dEps)

{
  double dVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  LLPoint *pLVar5;
  LLPoint LVar6;
  double distbase;
  double dDistFromPt;
  double dCrsFromPt;
  InverseResult result;
  LLPoint geoPt;
  double local_100;
  LLPoint *local_f8;
  undefined8 uStack_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  int *local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  Locus *local_98;
  double local_90;
  LLPoint local_88;
  double local_78;
  double local_70;
  InverseResult local_68;
  LLPoint local_48;
  
  local_68.azimuth = 0.0;
  local_68.reverseAzimuth = 0.0;
  local_68.distance = 0.0;
  local_f8 = &loc1->locusStart;
  local_b8 = dir;
  local_90 = dEps;
  DistVincenty(local_f8,&loc1->locusEnd,&local_68);
  local_e8 = local_68.azimuth;
  local_98 = loc2;
  DistVincenty(&loc2->locusEnd,&loc2->locusStart,&local_68);
  piVar2 = local_b8;
  iVar3 = TangentFixedRadiusArc
                    (local_f8,local_e8,&loc2->locusEnd,local_68.azimuth + 3.141592653589793,radius,
                     local_b8,center,intersection1,intersection2,dTol);
  if (iVar3 == 0) {
    return 0;
  }
  DistVincenty(center,intersection1,&local_68);
  local_f8 = (LLPoint *)local_68.azimuth;
  DistVincenty(center,intersection2,&local_68);
  dVar1 = SignAzimuthDifference((double)local_f8,local_68.azimuth);
  local_f8 = (LLPoint *)sin(ABS(dVar1) * 0.5);
  dVar1 = cos(radius / kSphereRadius);
  local_a8 = acos(dVar1 * (double)local_f8);
  local_a8 = local_a8 + local_a8;
  DistVincenty(&loc1->geoStart,&loc1->geoEnd,&local_68);
  local_e0 = local_68.azimuth;
  local_b0 = atan((loc1->endDist - loc1->startDist) / local_68.distance);
  LVar6 = PerpIntercept(&loc1->geoStart,local_e0,intersection1,&local_70,&local_78,dTol);
  local_88.latitude = LVar6.latitude;
  local_88.longitude = LVar6.longitude;
  DistVincenty(&loc1->geoStart,&local_88,&local_68);
  local_100 = local_68.distance;
  local_d8 = 0.0;
  dStack_d0 = 0.0;
  local_c8 = 0.0;
  dStack_c0 = 0.0;
  uVar4 = 0;
  pLVar5 = (LLPoint *)0.0;
  do {
    if (uVar4 != 0) {
      if (((0xe < uVar4) || (NAN(local_100))) || (ABS((double)pLVar5) <= dTol)) {
        return 1;
      }
      LVar6 = DestVincenty(&loc1->geoStart,local_e0,local_100);
      local_88.latitude = LVar6.latitude;
      local_88.longitude = LVar6.longitude;
    }
    LVar6 = PointOnLocusP(loc1,&local_88,dTol,local_90);
    intersection1->latitude = LVar6.latitude;
    intersection1->longitude = LVar6.longitude;
    local_48.latitude = 0.0;
    local_48.longitude = 0.0;
    dVar1 = LocusCrsAtPoint(loc1,intersection1,&local_48,1e-08);
    LVar6 = DestVincenty(intersection1,dVar1 + (double)*piVar2 * -1.5707963267948966,radius);
    center->latitude = LVar6.latitude;
    center->longitude = LVar6.longitude;
    iVar3 = LocusPerpIntercept(local_98,center,&local_70,&local_78,intersection2,dTol);
    if (iVar3 == 0) {
      intersection2->latitude = -INFINITY;
      intersection2->longitude = -INFINITY;
    }
    DistVincenty(center,intersection2,&local_68);
    local_f8 = (LLPoint *)(local_68.distance - radius);
    local_c8 = dStack_c0;
    dStack_c0 = local_100;
    local_d8 = dStack_d0;
    uStack_f0 = 0;
    dStack_d0 = (double)local_f8;
    if (uVar4 == 0) {
      local_e8 = local_100;
      local_a0 = cos(local_b0);
      dVar1 = sin(local_a8);
      local_100 = (local_a0 / dVar1) * (double)local_f8 + local_e8;
    }
    else {
      FindLinearRoot(&local_c8,&local_d8,&local_100);
    }
    uVar4 = uVar4 + 1;
    pLVar5 = local_f8;
  } while( true );
}

Assistant:

int LocusTanFixedRadiusArc(const Locus &loc1, const Locus &loc2, double radius,
                               int &dir, LLPoint &center, LLPoint &intersection1, LLPoint &intersection2,
                               double dTol, double dEps)
    {
        InverseResult result;
        DistVincenty(loc1.locusStart, loc1.locusEnd, result);
        const double crs12 = result.azimuth;

        DistVincenty(loc2.locusEnd, loc2.locusStart, result);
        const double crs32 = result.azimuth + M_PI;

        if (TangentFixedRadiusArc(loc1.locusStart, crs12, loc2.locusEnd, crs32,
                                  radius, dir, center, intersection1, intersection2, dTol) == 0)
            return 0;

        DistVincenty(center, intersection1, result);
        const double rcrs1 = result.azimuth;

        DistVincenty(center, intersection2, result);
        const double angle = fabs(SignAzimuthDifference(rcrs1, result.azimuth));
        const double vertexAngle = 2 * acos(sin(angle / 2.0) * cos(radius / kSphereRadius));

        DistVincenty(loc1.geoStart, loc1.geoEnd, result);
        const double geoCrs1 = result.azimuth;
        const double locAngle = atan((loc1.endDist - loc1.startDist) / result.distance);

        double dCrsFromPt, dDistFromPt;
        LLPoint geoPt1 = PerpIntercept(loc1.geoStart, geoCrs1, intersection1, dCrsFromPt, dDistFromPt, dTol);
        DistVincenty(loc1.geoStart, geoPt1, result);
        double distbase = result.distance;

        double distarray[2], errarray[2];
        distarray[0] = distarray[1] = errarray[0] = errarray[1] = 0.0;

        const int maxCount = 15;
        double dErr = 0.0;
        int k = 0;
        while (k == 0 || (!std::isnan(distbase) && k < maxCount && fabs(dErr) > dTol))
        {
            if (k > 0)
            {
                geoPt1 = DestVincenty(loc1.geoStart, geoCrs1, distbase);
            }

            intersection1 = PointOnLocusP(loc1, geoPt1, dTol, dEps);
            LLPoint geoPt;
            const double lcrs1 = LocusCrsAtPoint(loc1, intersection1, geoPt, 1e-8) - dir * M_PI_2;
            center = DestVincenty(intersection1, lcrs1, radius);

            if (!LocusPerpIntercept(loc2, center, dCrsFromPt, dDistFromPt, intersection2, dTol))
            {
                intersection2.Set(-HUGE_VAL, -HUGE_VAL);
            }

            DistVincenty(center, intersection2, result);
            dErr = result.distance - radius;
            distarray[0] = distarray[1];
            distarray[1] = distbase;
            errarray[0] = errarray[1];
            errarray[1] = dErr;

            if (k == 0)
                distbase = distbase + dErr * (cos(locAngle) / sin(vertexAngle));
            else
                FindLinearRoot(distarray, errarray, distbase);
            k++;
        }
        return 1;
    }